

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isBilinearAnyCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths,float cmpReference,
               float result,bool isFixedPointDepth)

{
  float cmpValue_;
  float cmpValue__00;
  float cmpValue__01;
  bool bVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  float *pfVar6;
  float fVar7;
  float local_64;
  float local_5c;
  byte local_56;
  byte local_55;
  float maxBound;
  float minBound;
  float resErr;
  bool canBeFalse;
  bool canBeTrue;
  CmpResultSet cmp3;
  CmpResultSet cmp2;
  CmpResultSet cmp1;
  CmpResultSet cmp0;
  float d3;
  float d2;
  float d1;
  float d0;
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec4 *depths_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  pfVar6 = Vector<float,_4>::operator[](depths,0);
  fVar7 = *pfVar6;
  pfVar6 = Vector<float,_4>::operator[](depths,1);
  cmpValue_ = *pfVar6;
  pfVar6 = Vector<float,_4>::operator[](depths,2);
  cmpValue__00 = *pfVar6;
  pfVar6 = Vector<float,_4>::operator[](depths,3);
  cmpValue__01 = *pfVar6;
  CVar2 = execCompare(compareMode,fVar7,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar3 = execCompare(compareMode,cmpValue_,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar4 = execCompare(compareMode,cmpValue__00,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar5 = execCompare(compareMode,cmpValue__01,cmpReference,prec->referenceBits,isFixedPointDepth);
  local_55 = 1;
  if (((((ushort)CVar2 & 1) == 0) && (local_55 = 1, ((ushort)CVar3 & 1) == 0)) &&
     (local_55 = 1, ((ushort)CVar4 & 1) == 0)) {
    resErr._0_1_ = CVar5.isTrue;
    local_55 = resErr._0_1_;
  }
  local_56 = 1;
  if (((((ushort)CVar2 & 0x100) == 0) && (local_56 = 1, ((ushort)CVar3 & 0x100) == 0)) &&
     (local_56 = 1, ((ushort)CVar4 & 0x100) == 0)) {
    resErr._1_1_ = CVar5.isFalse;
    local_56 = resErr._1_1_;
  }
  fVar7 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
  local_5c = 0.0;
  if ((local_56 & 1) == 0) {
    local_5c = 1.0;
  }
  local_64 = 1.0;
  if ((local_55 & 1) == 0) {
    local_64 = 0.0;
  }
  bVar1 = de::inRange<float>(result,local_5c - fVar7,local_64 + fVar7);
  return bVar1;
}

Assistant:

static bool isBilinearAnyCompareValid (const Sampler::CompareMode	compareMode,
									   const TexComparePrecision&	prec,
									   const Vec4&					depths,
									   const float					cmpReference,
									   const float					result,
									   const bool					isFixedPointDepth)
{
	DE_ASSERT(prec.pcfBits == 0);

	const float			d0			= depths[0];
	const float			d1			= depths[1];
	const float			d2			= depths[2];
	const float			d3			= depths[3];

	const CmpResultSet	cmp0		= execCompare(compareMode, d0, cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp1		= execCompare(compareMode, d1, cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp2		= execCompare(compareMode, d2, cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp3		= execCompare(compareMode, d3, cmpReference, prec.referenceBits, isFixedPointDepth);

	const bool			canBeTrue	= cmp0.isTrue || cmp1.isTrue || cmp2.isTrue || cmp3.isTrue;
	const bool			canBeFalse	= cmp0.isFalse || cmp1.isFalse || cmp2.isFalse || cmp3.isFalse;

	const float			resErr		= computeFixedPointError(prec.resultBits);

	const float			minBound	= canBeFalse ? 0.0f : 1.0f;
	const float			maxBound	= canBeTrue ? 1.0f : 0.0f;

	return de::inRange(result, minBound-resErr, maxBound+resErr);
}